

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void __thiscall
Js::SegmentBTreeRoot::Add(SegmentBTreeRoot *this,Recycler *recycler,SparseArraySegmentBase *newSeg)

{
  Type *addr;
  Type *addr_00;
  SegmentBTree *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  Recycler *pRVar5;
  undefined4 *puVar6;
  SegmentBTree *child;
  SparseArraySegmentBase **ppSVar7;
  uint *puVar8;
  long lVar9;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if ((this->super_SegmentBTree).segmentCount == 0x27) {
    local_60 = (undefined1  [8])&SegmentBTree::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0x28;
    data.count = (size_t)anon_var_dwarf_6ad2a13;
    data.filename._0_4_ = 0xbf;
    pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_60);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00b68eda;
      *puVar6 = 0;
    }
    child = (SegmentBTree *)
            Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                      (pRVar5,0x500);
    if (child == (SegmentBTree *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00b68eda;
      *puVar6 = 0;
    }
    lVar9 = 0;
    data._32_8_ = newSeg;
    do {
      SegmentBTree::SegmentBTree((SegmentBTree *)((long)&(child->keys).ptr + lVar9));
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x500);
    puVar8 = (this->super_SegmentBTree).keys.ptr;
    Memory::Recycler::WBSetBit((char *)child);
    (child->keys).ptr = puVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(child);
    ppSVar7 = (this->super_SegmentBTree).segments.ptr;
    Memory::Recycler::WBSetBit((char *)&child->segments);
    (child->segments).ptr = ppSVar7;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&child->segments);
    pSVar1 = (this->super_SegmentBTree).children.ptr;
    Memory::Recycler::WBSetBit((char *)&child->children);
    (child->children).ptr = pSVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&child->children);
    child->segmentCount = (this->super_SegmentBTree).segmentCount;
    (this->super_SegmentBTree).segmentCount = 0;
    local_60 = (undefined1  [8])&SparseArraySegmentBase*::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0x27;
    data.count = (size_t)anon_var_dwarf_6ad2a13;
    data.filename._0_4_ = 0xc5;
    pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_60);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00b68eda;
      *puVar6 = 0;
    }
    ppSVar7 = (SparseArraySegmentBase **)
              Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                        (pRVar5,0x138);
    if (ppSVar7 == (SparseArraySegmentBase **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00b68eda;
      *puVar6 = 0;
    }
    addr = &(this->super_SegmentBTree).segments;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = ppSVar7;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    local_60 = (undefined1  [8])&unsigned_int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0x27;
    data.count = (size_t)anon_var_dwarf_6ad2a13;
    data.filename._0_4_ = 0xc6;
    pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_60);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00b68eda;
      *puVar6 = 0;
    }
    puVar8 = (uint *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                               (pRVar5,0x9c);
    if (puVar8 == (uint *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00b68eda:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    addr_00 = &(this->super_SegmentBTree).children;
    Memory::Recycler::WBSetBit((char *)this);
    (this->super_SegmentBTree).keys.ptr = puVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    Memory::Recycler::WBSetBit((char *)addr_00);
    (this->super_SegmentBTree).children.ptr = child;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
    SegmentBTree::SplitChild(recycler,&this->super_SegmentBTree,0,child);
    newSeg = (SparseArraySegmentBase *)data._32_8_;
  }
  SegmentBTree::InsertNonFullNode(recycler,&this->super_SegmentBTree,newSeg);
  return;
}

Assistant:

void SegmentBTreeRoot::Add(Recycler* recycler, SparseArraySegmentBase* newSeg)
    {

        if (IsFullNode())
        {
            SegmentBTree * children = AllocatorNewArrayZ(Recycler, recycler, SegmentBTree, MaxDegree);
            children[0] = *this;

            // Even though the segments point to a GC pointer, the main array should keep a references
            // as well.  So just make it a leaf allocation
            this->segmentCount = 0;
            this->segments = AllocatorNewArrayLeafZ(Recycler, recycler, SparseArraySegmentBase*, MaxKeys);
            this->keys = AllocatorNewArrayLeafZ(Recycler,recycler,uint32,MaxKeys);
            this->children = children;

            // This split is the only way the tree gets deeper
            SplitChild(recycler, this, 0, &children[0]);
        }
        InsertNonFullNode(recycler, this, newSeg);
    }